

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

int MOJOSHADER_maxShaderModel(char *profile)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(profile,"d3d");
  uVar2 = 3;
  if (iVar1 != 0) {
    iVar1 = strcmp(profile,"bytecode");
    if (iVar1 != 0) {
      iVar1 = strcmp(profile,"glsl");
      if (iVar1 != 0) {
        iVar1 = strcmp(profile,"glsl120");
        if (iVar1 != 0) {
          iVar1 = strcmp(profile,"glsles");
          if (iVar1 != 0) {
            iVar1 = strcmp(profile,"arb1");
            uVar2 = 2;
            if (iVar1 != 0) {
              iVar1 = strcmp(profile,"nv2");
              if (iVar1 != 0) {
                iVar1 = strcmp(profile,"nv3");
                if (iVar1 != 0) {
                  iVar1 = strcmp(profile,"nv4");
                  uVar2 = 3;
                  if (iVar1 != 0) {
                    iVar1 = strcmp(profile,"metal");
                    uVar2 = -(uint)(iVar1 != 0) | 3;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int MOJOSHADER_maxShaderModel(const char *profile)
{
    #define PROFILE_SHADER_MODEL(p,v) if (strcmp(profile, p) == 0) return v;
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_D3D, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_BYTECODE, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSL, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSL120, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSLES, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_ARB1, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV2, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV3, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV4, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_METAL, 3);
    #undef PROFILE_SHADER_MODEL
    return -1;  // unknown profile?
}